

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageAndPreserveBufferTest::iterate
          (SwapBuffersWithDamageAndPreserveBufferTest *this)

{
  Frame *frame;
  NativeWindow *pNVar1;
  int iVar2;
  EGLint numFrames;
  EGLint width;
  deUint32 dVar3;
  Library *egl;
  int iVar4;
  int *piVar5;
  int in_R9D;
  uint uVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  vector<int,_std::allocator<int>_> damageRegion;
  FrameSequence frameSequence;
  Random rnd;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  pointer local_60;
  FrameSequence local_58;
  deRandom local_40;
  
  deRandom_init(&local_40,(this->super_SwapBuffersWithDamageTest).m_seed);
  egl = EglTestContext::getLibrary
                  ((this->super_SwapBuffersWithDamageTest).super_TestCase.m_eglTestCtx);
  numFrames = eglu::querySurfaceInt
                        (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                         (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3057);
  width = eglu::querySurfaceInt
                    (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                     (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3056);
  fVar8 = deRandom_getFloat(&local_40);
  fVar9 = deRandom_getFloat(&local_40);
  fVar10 = deRandom_getFloat(&local_40);
  generateFrameSequence
            (&local_58,&(this->super_SwapBuffersWithDamageTest).m_frameDrawType,(Random *)&local_40,
             numFrames,width,in_R9D);
  tcu::TestContext::setTestResult
            ((this->super_SwapBuffersWithDamageTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  (*egl->_vptr_Library[0x30])
            (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
             (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3093,0x3094);
  dVar3 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar3,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                   ,0x1eb);
  if (0 < (this->super_SwapBuffersWithDamageTest).m_iterationTimes) {
    local_60 = local_58.
               super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = width / 2;
    iVar2 = numFrames * 2;
    uVar6 = 0;
    do {
      (*(this->super_SwapBuffersWithDamageTest).m_gl.clearColor)(fVar8,fVar9,fVar10,1.0);
      (*(this->super_SwapBuffersWithDamageTest).m_gl.clear)(0x4000);
      (*egl->_vptr_Library[0x32])
                (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                 (this->super_SwapBuffersWithDamageTest).m_eglSurface,0,0);
      dVar3 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar3,"swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, DE_NULL, 0)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                       ,0x1f0);
      lVar7 = 0;
      do {
        frame = (Frame *)((long)&local_60->width + lVar7);
        getDamageRegion(&local_78,frame);
        GLES2Renderer::render
                  ((this->super_SwapBuffersWithDamageTest).m_gles2Renderer,numFrames,width,frame);
        if ((this->super_SwapBuffersWithDamageTest).m_resizeType == RESIZETYPE_BEFORE_SWAP) {
          if ((uVar6 & 1) == 0) {
            piVar5 = &local_80;
            local_80 = iVar2;
            local_7c = iVar4;
          }
          else {
            piVar5 = &local_88;
            local_88 = iVar4;
            local_84 = iVar2;
          }
          pNVar1 = (this->super_SwapBuffersWithDamageTest).m_window;
          (*pNVar1->_vptr_NativeWindow[6])(pNVar1,piVar5);
        }
        (*egl->_vptr_Library[0x32])
                  (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                   (this->super_SwapBuffersWithDamageTest).m_eglSurface);
        dVar3 = (*egl->_vptr_Library[0x1f])(egl);
        eglu::checkError(dVar3,
                         "swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                         ,0x201);
        if ((this->super_SwapBuffersWithDamageTest).m_resizeType == RESIZETYPE_AFTER_SWAP) {
          if ((uVar6 & 1) == 0) {
            piVar5 = &local_90;
            local_90 = iVar2;
            local_8c = iVar4;
          }
          else {
            piVar5 = &local_98;
            local_98 = iVar4;
            local_94 = iVar2;
          }
          pNVar1 = (this->super_SwapBuffersWithDamageTest).m_window;
          (*pNVar1->_vptr_NativeWindow[6])(pNVar1,piVar5);
        }
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0x300);
      uVar6 = uVar6 + 1;
    } while ((int)uVar6 < (this->super_SwapBuffersWithDamageTest).m_iterationTimes);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector(&local_58);
  return STOP;
}

Assistant:

TestCase::IterateResult SwapBuffersWithDamageAndPreserveBufferTest::iterate (void)
{

	de::Random			rnd				(m_seed);
	const Library&		egl				= m_eglTestCtx.getLibrary();
	const int			width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int			height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float			clearRed		= rnd.getFloat();
	const float			clearGreen		= rnd.getFloat();
	const float			clearBlue		= rnd.getFloat();
	const tcu::Vec4		clearColor		(clearRed, clearGreen, clearBlue, 1.0f);
	const int			numFrames		= 24; // (width, height) = (480, 480) --> numFrame = 24, divisible
	const FrameSequence frameSequence	= generateFrameSequence(m_frameDrawType, rnd, numFrames, width, height);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED));

	for (int iterationNdx = 0; iterationNdx < m_iterationTimes; iterationNdx++)
	{
		clearColorScreen(m_gl, clearColor);
		EGLU_CHECK_CALL(egl, swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, DE_NULL, 0));

		for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
		{
			const Frame&	currentFrame = frameSequence[frameNdx];
			vector<EGLint>	damageRegion = getDamageRegion(currentFrame);

			m_gles2Renderer->render(width, height, currentFrame);

			if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			EGLU_CHECK_CALL(egl, swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4));

			if (m_resizeType == RESIZETYPE_AFTER_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}
		}
	}

	return STOP;
}